

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O0

void UpdateDominantCostRange(VP8LHistogram *h,DominantCostRange *c)

{
  DominantCostRange *c_local;
  VP8LHistogram *h_local;
  
  if (c->literal_max_ < h->literal_cost_) {
    c->literal_max_ = h->literal_cost_;
  }
  if (h->literal_cost_ <= c->literal_min_ && c->literal_min_ != h->literal_cost_) {
    c->literal_min_ = h->literal_cost_;
  }
  if (c->red_max_ < h->red_cost_) {
    c->red_max_ = h->red_cost_;
  }
  if (h->red_cost_ <= c->red_min_ && c->red_min_ != h->red_cost_) {
    c->red_min_ = h->red_cost_;
  }
  if (c->blue_max_ < h->blue_cost_) {
    c->blue_max_ = h->blue_cost_;
  }
  if (h->blue_cost_ <= c->blue_min_ && c->blue_min_ != h->blue_cost_) {
    c->blue_min_ = h->blue_cost_;
  }
  return;
}

Assistant:

static void UpdateDominantCostRange(
    const VP8LHistogram* const h, DominantCostRange* const c) {
  if (c->literal_max_ < h->literal_cost_) c->literal_max_ = h->literal_cost_;
  if (c->literal_min_ > h->literal_cost_) c->literal_min_ = h->literal_cost_;
  if (c->red_max_ < h->red_cost_) c->red_max_ = h->red_cost_;
  if (c->red_min_ > h->red_cost_) c->red_min_ = h->red_cost_;
  if (c->blue_max_ < h->blue_cost_) c->blue_max_ = h->blue_cost_;
  if (c->blue_min_ > h->blue_cost_) c->blue_min_ = h->blue_cost_;
}